

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsnode_bmod.c
# Opt level: O0

int dsnode_bmod(int jcol,int jsupno,int fsupc,double *dense,double *tempv,GlobalLU_t *Glu,
               SuperLUStat_t *stat)

{
  int iVar1;
  int iVar2;
  flops_t *pfVar3;
  int_t *piVar4;
  int_t *piVar5;
  void *pvVar6;
  int_t *piVar7;
  int ldm;
  int ncol;
  int nrow_00;
  int local_88;
  int local_84;
  int_t iptr;
  int_t i;
  flops_t *ops;
  int_t luptr;
  int_t *xlusup;
  double *lusup;
  int_t *xlsub;
  int_t *lsub;
  int_t nextlu;
  int_t ufirst;
  int_t irow;
  int_t isub;
  int nrow;
  int nsupr;
  int nsupc;
  GlobalLU_t *Glu_local;
  double *tempv_local;
  double *dense_local;
  int fsupc_local;
  int jsupno_local;
  int jcol_local;
  
  pfVar3 = stat->ops;
  piVar4 = Glu->lsub;
  piVar5 = Glu->xlsub;
  pvVar6 = Glu->lusup;
  piVar7 = Glu->xlusup;
  lsub._4_4_ = piVar7[jcol];
  for (ufirst = piVar5[fsupc]; ufirst < piVar5[fsupc + 1]; ufirst = ufirst + 1) {
    iVar1 = piVar4[ufirst];
    *(double *)((long)pvVar6 + (long)lsub._4_4_ * 8) = dense[iVar1];
    dense[iVar1] = 0.0;
    lsub._4_4_ = lsub._4_4_ + 1;
  }
  piVar7[jcol + 1] = lsub._4_4_;
  if (fsupc < jcol) {
    iVar1 = piVar7[fsupc];
    ldm = piVar5[fsupc + 1] - piVar5[fsupc];
    ncol = jcol - fsupc;
    iVar2 = piVar7[jcol];
    nrow_00 = ldm - ncol;
    pfVar3[0x13] = (float)(ncol * (ncol + -1)) + pfVar3[0x13];
    pfVar3[0x14] = (float)(nrow_00 * 2 * ncol) + pfVar3[0x14];
    dlsolve(ldm,ncol,(double *)((long)pvVar6 + (long)iVar1 * 8),
            (double *)((long)pvVar6 + (long)iVar2 * 8));
    dmatvec(ldm,nrow_00,ncol,(double *)((long)pvVar6 + (long)(iVar1 + ncol) * 8),
            (double *)((long)pvVar6 + (long)iVar2 * 8),tempv);
    local_88 = iVar2 + ncol;
    for (local_84 = 0; local_84 < nrow_00; local_84 = local_84 + 1) {
      *(double *)((long)pvVar6 + (long)local_88 * 8) =
           *(double *)((long)pvVar6 + (long)local_88 * 8) - tempv[local_84];
      tempv[local_84] = 0.0;
      local_88 = local_88 + 1;
    }
  }
  return 0;
}

Assistant:

int
dsnode_bmod (
	    const int  jcol,	  /* in */
	    const int  jsupno,    /* in */
	    const int  fsupc,     /* in */
	    double     *dense,    /* in */
	    double     *tempv,    /* working array */
	    GlobalLU_t *Glu,      /* modified */
	    SuperLUStat_t *stat   /* output */
	    )
{
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int            incx = 1, incy = 1;
    double         alpha = -1.0, beta = 1.0;
#endif

    int     nsupc, nsupr, nrow;
    int_t   isub, irow;
    int_t   ufirst, nextlu;
    int_t   *lsub, *xlsub;
    double *lusup;
    int_t   *xlusup, luptr;
    flops_t *ops = stat->ops;

    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (double *) Glu->lusup;
    xlusup  = Glu->xlusup;

    nextlu = xlusup[jcol];
    
    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
	dense[irow] = 0;
	++nextlu;
    }

    xlusup[jcol + 1] = nextlu;	/* Initialize xlusup for next column */
    
    if ( fsupc < jcol ) {

	luptr = xlusup[fsupc];
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nsupc = jcol - fsupc;	/* Excluding jcol */
	ufirst = xlusup[jcol];	/* Points to the beginning of column
				   jcol in supernode L\U(jsupno). */
	nrow = nsupr - nsupc;

	ops[TRSV] += nsupc * (nsupc - 1);
	ops[GEMV] += 2 * nrow * nsupc;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	STRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	SGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	dtrsv_( "L", "N", "U", &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	dgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	dlsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );
	dmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc], 
			&lusup[ufirst], &tempv[0] );

	int_t i, iptr; 
        /* Scatter tempv[*] into lusup[*] */
	iptr = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    lusup[iptr++] -= tempv[i];
	    tempv[i] = 0.0;
	}
#endif

    }

    return 0;
}